

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgParser.cpp
# Opt level: O1

void __thiscall ArgParser::defaultValues(ArgParser *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->input_file)._M_string_length,0x13318a);
  std::__cxx11::string::_M_replace
            ((ulong)&this->output_file,0,(char *)(this->output_file)._M_string_length,0x13318a);
  this->width = 100;
  this->height = 100;
  this->iters = 10;
  this->length = 1.0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->log_file,0,(char *)(this->log_file)._M_string_length,0x13318a);
  return;
}

Assistant:

void
ArgParser::defaultValues() {
    // rendering output
    input_file = "";
    output_file = "";
    width = 100;
    height = 100;

    // rendering options
    iters = 10;
    length = 1.f;

    // logging
    log_file = "";
}